

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O2

void __thiscall uv::AcceptClient::Close(AcceptClient *this)

{
  char *pcVar1;
  TcpClientCtx *pTVar2;
  CStringStream *pCVar3;
  ILog4zManager *pIVar4;
  long *in_FS_OFFSET;
  CStringStream ss;
  
  if (this->isclosed_ == false) {
    pTVar2 = this->client_handle_;
    (pTVar2->tcphandle).data = this;
    uv_close(pTVar2,AfterClientClose);
    ss.m_pEnd = (char *)*in_FS_OFFSET;
    pcVar1 = ss.m_pEnd + -0x800;
    ss.m_pBegin = pcVar1;
    ss.m_pCur = pcVar1;
    pCVar3 = zsummer::log4z::CStringStream::operator<<(&ss,"client(");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3,this);
    zsummer::log4z::CStringStream::operator<<(pCVar3,")close");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(&ss," ( ");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar3,0x218);
    pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar4->_vptr_ILog4zManager[8])(pIVar4,0,1,pcVar1);
  }
  return;
}

Assistant:

void AcceptClient::Close()
{
    if (isclosed_) {
        return;
    }
    client_handle_->tcphandle.data = this;
    //send close command
    uv_close((uv_handle_t*)&client_handle_->tcphandle, AfterClientClose);
    LOGI("client(" << this << ")close");
}